

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.h
# Opt level: O0

StatusOr<google::protobuf::json_internal::UntypedMessage> *
google::protobuf::json_internal::UntypedMessage::ParseFromStream
          (StatusOr<google::protobuf::json_internal::UntypedMessage> *__return_storage_ptr__,
          Message *desc,CodedInputStream *stream)

{
  bool bVar1;
  optional<int> local_58;
  undefined1 local_50 [8];
  Status _status;
  UntypedMessage msg;
  CodedInputStream *stream_local;
  Message *desc_local;
  
  UntypedMessage((UntypedMessage *)&_status,desc);
  std::optional<int>::optional(&local_58);
  Decode((UntypedMessage *)local_50,(CodedInputStream *)&_status,(optional<int>)stream);
  bVar1 = absl::lts_20240722::Status::ok((Status *)local_50);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    absl::lts_20240722::StatusOr<google::protobuf::json_internal::UntypedMessage>::
    StatusOr<const_absl::lts_20240722::Status,_0>(__return_storage_ptr__,(Status *)local_50);
  }
  absl::lts_20240722::Status::~Status((Status *)local_50);
  if (!bVar1) {
    absl::lts_20240722::StatusOr<google::protobuf::json_internal::UntypedMessage>::
    StatusOr<google::protobuf::json_internal::UntypedMessage,_0>
              (__return_storage_ptr__,(UntypedMessage *)&_status);
  }
  ~UntypedMessage((UntypedMessage *)&_status);
  return __return_storage_ptr__;
}

Assistant:

static absl::StatusOr<UntypedMessage> ParseFromStream(
      const ResolverPool::Message* desc, io::CodedInputStream& stream) {
    UntypedMessage msg(std::move(desc));
    RETURN_IF_ERROR(msg.Decode(stream));
    return std::move(msg);
  }